

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DDLNode.cpp
# Opt level: O3

void __thiscall ODDLParser::DDLNode::detachParent(DDLNode *this)

{
  DDLNode **__src;
  DDLNode *pDVar1;
  __normal_iterator<ODDLParser::DDLNode_**,_std::vector<ODDLParser::DDLNode_*,_std::allocator<ODDLParser::DDLNode_*>_>_>
  __dest;
  DDLNode **ppDVar2;
  
  pDVar1 = this->m_parent;
  if (pDVar1 != (DDLNode *)0x0) {
    __dest = std::
             __find_if<__gnu_cxx::__normal_iterator<ODDLParser::DDLNode**,std::vector<ODDLParser::DDLNode*,std::allocator<ODDLParser::DDLNode*>>>,__gnu_cxx::__ops::_Iter_equals_val<ODDLParser::DDLNode*const>>
                       ((pDVar1->m_children).
                        super__Vector_base<ODDLParser::DDLNode_*,_std::allocator<ODDLParser::DDLNode_*>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (pDVar1->m_children).
                        super__Vector_base<ODDLParser::DDLNode_*,_std::allocator<ODDLParser::DDLNode_*>_>
                        ._M_impl.super__Vector_impl_data._M_finish);
    pDVar1 = this->m_parent;
    ppDVar2 = (pDVar1->m_children).
              super__Vector_base<ODDLParser::DDLNode_*,_std::allocator<ODDLParser::DDLNode_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    if (ppDVar2 != __dest._M_current) {
      __src = __dest._M_current + 1;
      if (__src != ppDVar2) {
        memmove(__dest._M_current,__src,(long)ppDVar2 - (long)__src);
        ppDVar2 = (pDVar1->m_children).
                  super__Vector_base<ODDLParser::DDLNode_*,_std::allocator<ODDLParser::DDLNode_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
      }
      (pDVar1->m_children).
      super__Vector_base<ODDLParser::DDLNode_*,_std::allocator<ODDLParser::DDLNode_*>_>._M_impl.
      super__Vector_impl_data._M_finish = ppDVar2 + -1;
    }
    this->m_parent = (DDLNode *)0x0;
  }
  return;
}

Assistant:

void DDLNode::detachParent() {
    if( ddl_nullptr != m_parent ) {
        DDLNodeIt it = std::find( m_parent->m_children.begin(), m_parent->m_children.end(), this );
        if( m_parent->m_children.end() != it ) {
            m_parent->m_children.erase( it );
        }
        m_parent = ddl_nullptr;
    }
}